

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSatClp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_54;
  int c;
  int fVerbose;
  int fCnfShared;
  int fReverse;
  int fCanon;
  int nCostMax;
  int nBTLimit;
  int nCubeLim;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  nCostMax = 0;
  fCanon = 1000000;
  fReverse = 20000000;
  fCnfShared = 0;
  fVerbose = 0;
  c = 0;
  local_54 = 0;
  Extra_UtilGetoptReset();
LAB_00265188:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"CLZcrsvh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsLogic(pAVar2);
      if ((iVar1 == 0) && (iVar1 = Abc_NtkIsStrash(pAVar2), iVar1 == 0)) {
        Abc_Print(-1,"Can only collapse a logic network or an AIG.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        pAVar2 = Abc_NtkStrash(pAVar2,0,0,0);
        _nBTLimit = Abc_NtkCollapseSat(pAVar2,nCostMax,fCanon,fReverse,fCnfShared,fVerbose,c,
                                       local_54);
        Abc_NtkDelete(pAVar2);
      }
      else {
        _nBTLimit = Abc_NtkCollapseSat(pAVar2,nCostMax,fCanon,fReverse,fCnfShared,fVerbose,c,
                                       local_54);
      }
      if (_nBTLimit == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Collapsing has failed.\n");
        return 0;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,_nBTLimit);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0026545d;
      }
      nCostMax = atoi(argv[globalUtilOptind]);
      iVar1 = nCostMax;
      break;
    default:
      goto LAB_0026545d;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_0026545d;
      }
      fCanon = atoi(argv[globalUtilOptind]);
      iVar1 = fCanon;
      break;
    case 0x5a:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-Z\" should be followed by an integer.\n");
        goto LAB_0026545d;
      }
      fReverse = atoi(argv[globalUtilOptind]);
      iVar1 = fReverse;
      break;
    case 99:
      fCnfShared = fCnfShared ^ 1;
      goto LAB_00265188;
    case 0x68:
      goto LAB_0026545d;
    case 0x72:
      fVerbose = fVerbose ^ 1;
      goto LAB_00265188;
    case 0x73:
      c = c ^ 1;
      goto LAB_00265188;
    case 0x76:
      local_54 = local_54 ^ 1;
      goto LAB_00265188;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0026545d:
      Abc_Print(-2,"usage: satclp [-CLZ num] [-crsvh]\n");
      Abc_Print(-2,"\t         performs SAT based collapsing\n");
      Abc_Print(-2,"\t-C num : the limit on the SOP size of one output [default = %d]\n",
                (ulong)(uint)nCostMax);
      Abc_Print(-2,
                "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n",
                (ulong)(uint)fCanon);
      Abc_Print(-2,"\t-Z num : the limit on the cost of the largest output [default = %d]\n",
                (ulong)(uint)fReverse);
      pcVar3 = "no";
      if (fCnfShared != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggles using canonical ISOP computation [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggles using reverse veriable ordering [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggles shared CNF computation (non-canonical only) [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (local_54 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSatClp( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtkRes;
    int nCubeLim   =        0;
    int nBTLimit   =  1000000;
    int nCostMax   = 20000000;
    int fCanon     = 0;
    int fReverse   = 0;
    int fCnfShared = 0;
    int fVerbose   = 0;
    int c;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CLZcrsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubeLim < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'Z':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Z\" should be followed by an integer.\n" );
                goto usage;
            }
            nCostMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCostMax < 0 )
                goto usage;
            break;
        case 'c':
            fCanon ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 's':
            fCnfShared ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only collapse a logic network or an AIG.\n" );
        return 1;
    }

    // get the new network
    if ( Abc_NtkIsStrash(pNtk) )
        pNtkRes = Abc_NtkCollapseSat( pNtk, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkRes = Abc_NtkCollapseSat( pNtk, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Collapsing has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: satclp [-CLZ num] [-crsvh]\n" );
    Abc_Print( -2, "\t         performs SAT based collapsing\n" );
    Abc_Print( -2, "\t-C num : the limit on the SOP size of one output [default = %d]\n",              nCubeLim );
    Abc_Print( -2, "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-Z num : the limit on the cost of the largest output [default = %d]\n",          nCostMax );
    Abc_Print( -2, "\t-c     : toggles using canonical ISOP computation [default = %s]\n",             fCanon? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggles using reverse veriable ordering [default = %s]\n",              fReverse? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles shared CNF computation (non-canonical only) [default = %s]\n",  fCnfShared? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",                 fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}